

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseException.h
# Opt level: O2

void __thiscall
AutoArgParse::MissingMandatoryArgException::MissingMandatoryArgException
          (MissingMandatoryArgException *this,FlagStore *flagStore)

{
  FlagStore *in_RDX;
  string sStack_38;
  
  makeErrorMessage_abi_cxx11_(&sStack_38,(MissingMandatoryArgException *)flagStore,in_RDX);
  ParseException::ParseException(&this->super_ParseException,MISSING_MANDATORY_ARG,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  *(undefined ***)&this->super_ParseException = &PTR__ParseException_00110a98;
  this->flagStore = flagStore;
  return;
}

Assistant:

MissingMandatoryArgException(const FlagStore& flagStore)
        : ParseException(MISSING_MANDATORY_ARG, makeErrorMessage(flagStore)),
          flagStore(flagStore) {}